

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

Instr * IR::Instr::NewConstantLoad
                  (RegOpnd *dstOpnd,intptr_t varConst,ValueType type,Func *func,Var varLocal)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  int32 iVar5;
  IntConstOpnd *src1Opnd;
  Instr *pIVar6;
  intptr_t iVar7;
  AddrOpnd *pAVar8;
  undefined4 *puVar9;
  FloatConstOpnd *src1Opnd_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType;
  StackSym *pSVar10;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a [4];
  ValueType type_local;
  
  local_2a[0] = type.field_0;
  bVar3 = Js::TaggedInt::Is(varConst);
  if (bVar3) {
    iVar5 = Js::TaggedInt::ToInt32((Var)varConst);
    src1Opnd = IntConstOpnd::New((long)iVar5,TyInt32,func,false);
    pIVar6 = New(LdC_A_I4,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,func);
    pSVar10 = dstOpnd->m_sym;
    if (((pSVar10->field_0x18 & 1) != 0) && ((pSVar10->field_5).m_instrDef != (Instr *)0x0)) {
      StackSym::SetIsIntConst(pSVar10,(long)iVar5);
    }
    return pIVar6;
  }
  iVar7 = ThreadContextInfo::GetNullFrameDisplayAddr(func->m_threadContextInfo);
  if (iVar7 == varConst) {
    iVar7 = ThreadContextInfo::GetNullFrameDisplayAddr(func->m_threadContextInfo);
  }
  else {
    iVar7 = ThreadContextInfo::GetStrictNullFrameDisplayAddr(func->m_threadContextInfo);
    if (iVar7 != varConst) {
      ValueType::ValueType((ValueType *)&local_2c.field_0);
      bVar3 = ValueType::IsString((ValueType *)&local_2a[0].field_0);
      if (bVar3) {
        pAVar8 = AddrOpnd::New(varConst,AddrOpndKindDynamicVar,func,true,varLocal);
        pIVar6 = New(LdStr,&dstOpnd->super_Opnd,&pAVar8->super_Opnd,func);
        pSVar10 = dstOpnd->m_sym;
        bVar4 = 1;
        if ((pSVar10->field_0x18 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                             ,0xec0,"(dstOpnd->m_sym->m_isSingleDef)",
                             "dstOpnd->m_sym->m_isSingleDef");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar9 = 0;
          pSVar10 = dstOpnd->m_sym;
          bVar4 = pSVar10->field_0x18 & 1;
        }
        if ((bVar4 != 0) && ((pSVar10->field_5).m_instrDef != (Instr *)0x0)) {
          StackSym::SetIsStrConst(pSVar10);
        }
        Opnd::SetValueType(&dstOpnd->super_Opnd,(ValueType)0x800);
        valueType.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             (anon_union_2_4_ea848c7b_for_ValueType_13)0x800;
      }
      else {
        bVar3 = ValueType::IsNumber((ValueType *)&local_2a[0].field_0);
        if (bVar3) {
          src1Opnd_00 = FloatConstOpnd::New((Var)varConst,TyFloat64,func,(Var)0x0);
          pIVar6 = New(LdC_A_R8,&dstOpnd->super_Opnd,&src1Opnd_00->super_Opnd,func);
          pSVar10 = dstOpnd->m_sym;
          if ((pSVar10->field_0x18 & 1) == 0) {
            return pIVar6;
          }
          if ((pSVar10->field_5).m_instrDef == (Instr *)0x0) {
            return pIVar6;
          }
          StackSym::SetIsFloatConst(pSVar10);
          puVar1 = &dstOpnd->m_sym->field_0x18;
          *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffffd;
          return pIVar6;
        }
        bVar3 = ValueType::IsUndefined((ValueType *)&local_2a[0].field_0);
        local_2c = local_2a[0];
        if (((!bVar3) &&
            (bVar3 = ValueType::IsNull((ValueType *)&local_2a[0].field_0), local_2c = local_2a[0],
            !bVar3)) &&
           (bVar3 = ValueType::IsBoolean((ValueType *)&local_2a[0].field_0), local_2c = local_2a[0],
           !bVar3)) {
          local_2c.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               ValueType::GetObject(Object);
        }
        pAVar8 = AddrOpnd::New(varConst,AddrOpndKindDynamicVar,func,true,varLocal);
        pIVar6 = New(Ld_A,&dstOpnd->super_Opnd,&pAVar8->super_Opnd,func);
        pSVar10 = dstOpnd->m_sym;
        if (((*(uint *)&pSVar10->field_0x18 & 1) != 0) &&
           ((pSVar10->field_5).m_instrDef != (Instr *)0x0)) {
          *(uint *)&pSVar10->field_0x18 = *(uint *)&pSVar10->field_0x18 | 8;
        }
        Opnd::SetValueType(&dstOpnd->super_Opnd,(ValueType)local_2c.field_0);
        valueType = local_2c;
      }
      Opnd::SetValueType(&pAVar8->super_Opnd,(ValueType)valueType.field_0);
      return pIVar6;
    }
    iVar7 = ThreadContextInfo::GetStrictNullFrameDisplayAddr(func->m_threadContextInfo);
  }
  pAVar8 = AddrOpnd::New(iVar7,AddrOpndKindDynamicMisc,func,false,(Var)0x0);
  pIVar6 = New(Ld_A,&dstOpnd->super_Opnd,&pAVar8->super_Opnd,func);
  return pIVar6;
}

Assistant:

IR::Instr* IR::Instr::NewConstantLoad(IR::RegOpnd* dstOpnd, intptr_t varConst, ValueType type, Func* func, Js::Var varLocal/* = nullptr*/)
{
    IR::Opnd *srcOpnd = nullptr;
    IR::Instr *instr;

    if (Js::TaggedInt::Is(varConst))
    {
        IntConstType value = Js::TaggedInt::ToInt32((Js::Var)varConst);
        instr = IR::Instr::New(Js::OpCode::LdC_A_I4, dstOpnd, IR::IntConstOpnd::New(value, TyInt32, func), func);
        if (dstOpnd->m_sym->IsSingleDef())
        {
            dstOpnd->m_sym->SetIsIntConst(value);
        }
    }
    else
    {
        if (varConst == func->GetThreadContextInfo()->GetNullFrameDisplayAddr())
        {
            instr = IR::Instr::New(
                Js::OpCode::Ld_A,
                dstOpnd,
                IR::AddrOpnd::New(
                    func->GetThreadContextInfo()->GetNullFrameDisplayAddr(),
                    IR::AddrOpndKindDynamicMisc,
                    func),
                func);
        }
        else if (varConst == func->GetThreadContextInfo()->GetStrictNullFrameDisplayAddr())
        {
            instr = IR::Instr::New(
                Js::OpCode::Ld_A,
                dstOpnd,
                IR::AddrOpnd::New(
                    func->GetThreadContextInfo()->GetStrictNullFrameDisplayAddr(),
                    IR::AddrOpndKindDynamicMisc,
                    func),
                func);
        }
        else
        {

            ValueType valueType;
            if(type.IsString())
            {
                srcOpnd = IR::AddrOpnd::New(varConst, IR::AddrOpndKindDynamicVar, func, true, varLocal);
                instr = IR::Instr::New(Js::OpCode::LdStr, dstOpnd, srcOpnd, func);
                Assert(dstOpnd->m_sym->m_isSingleDef);
                if (dstOpnd->m_sym->IsSingleDef())
                {
                    dstOpnd->m_sym->SetIsStrConst();
                }
                dstOpnd->SetValueType(ValueType::String);
                srcOpnd->SetValueType(ValueType::String);
            }
            else if(type.IsNumber())
            {
                // TODO (michhol): OOP JIT. we may need to unbox before sending over const table

                if (!func->IsOOPJIT())
                {
                    srcOpnd = IR::FloatConstOpnd::New((Js::Var)varConst, TyFloat64, func);
                }
                else
                {
                    srcOpnd = IR::FloatConstOpnd::New((Js::Var)varConst, TyFloat64, func
#if !FLOATVAR
                        ,varLocal
#endif
                    );

                }

                instr = IR::Instr::New(Js::OpCode::LdC_A_R8, dstOpnd, srcOpnd, func);
                if (dstOpnd->m_sym->IsSingleDef())
                {
                    dstOpnd->m_sym->SetIsFloatConst();

#if FLOATVAR
                    dstOpnd->m_sym->m_isNotNumber = FALSE;
#else
                    // Don't set m_isNotNumber to true if the float constant value is an int32 or uint32. Uint32s may sometimes be
                    // treated as int32s for the purposes of int specialization.
                    dstOpnd->m_sym->m_isNotNumber = !Js::JavascriptNumber::IsInt32OrUInt32(((IR::FloatConstOpnd*)srcOpnd)->m_value);


#endif
                }
            }
            else
            {
                if (type.IsUndefined() || type.IsNull() || type.IsBoolean())
                {
                    valueType = type;
                }
                else
                {
                    valueType = ValueType::GetObject(ObjectType::Object);
                }
                srcOpnd = IR::AddrOpnd::New(varConst, IR::AddrOpndKindDynamicVar, func, true, varLocal);
                instr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, func);
                if (dstOpnd->m_sym->IsSingleDef())
                {
                    dstOpnd->m_sym->m_isConst = true;
                }
                dstOpnd->SetValueType(valueType);
                srcOpnd->SetValueType(valueType);
            }
        }
    }
    return instr;
}